

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

void __thiscall
QStyle::drawItemPixmap(QStyle *this,QPainter *painter,QRect *rect,int alignment,QPixmap *pixmap)

{
  int sy;
  int sx;
  int x;
  QFlagsStorage<Qt::AlignmentFlag> in_ECX;
  int in_EDI;
  long in_FS_OFFSET;
  QRect QVar1;
  qreal scale;
  QRect inter;
  QRect aligned;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  QFlag in_stack_ffffffffffffff34;
  qreal in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff44;
  QPixmap *pm;
  int in_stack_ffffffffffffff50;
  QPainter *this_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QSize *in_stack_ffffffffffffff68;
  LayoutDirection in_stack_ffffffffffffff70;
  QFlag local_20 [2];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPixmap::devicePixelRatio();
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sy = QGuiApplication::layoutDirection();
  QFlag::QFlag(local_20,in_ECX.i);
  QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
            ((QFlags<Qt::AlignmentFlag> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),in_stack_ffffffffffffff34
            );
  QPixmap::size();
  operator/((QSize *)CONCAT44(in_stack_ffffffffffffff44,sy),in_stack_ffffffffffffff38);
  local_18 = (undefined1  [16])
             alignedRect(in_stack_ffffffffffffff70,(Alignment)in_ECX.i,in_stack_ffffffffffffff68,
                         (QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  pm = (QPixmap *)local_18;
  QVar1 = QRect::intersected((QRect *)CONCAT44(in_stack_ffffffffffffff34.i,in_stack_ffffffffffffff30
                                              ),
                             (QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
  ;
  this_00 = (QPainter *)&stack0xffffffffffffffb8;
  QRect::x((QRect *)0x40a8c6);
  QRect::y((QRect *)0x40a8d4);
  sx = QRect::x((QRect *)0x40a8ec);
  QRect::x((QRect *)0x40a8fa);
  x = QRect::y((QRect *)0x40a910);
  QRect::y((QRect *)0x40a91e);
  QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  qRound(2.09367184937705e-317);
  QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  qRound(2.09368815354337e-317);
  QPainter::drawPixmap(this_00,x,in_stack_ffffffffffffff50,pm,sx,sy,in_EDI,QVar1.x1.m_i.m_i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyle::drawItemPixmap(QPainter *painter, const QRect &rect, int alignment,
                            const QPixmap &pixmap) const
{
    qreal scale = pixmap.devicePixelRatio();
    QRect aligned = alignedRect(QGuiApplication::layoutDirection(), QFlag(alignment), pixmap.size() / scale, rect);
    QRect inter = aligned.intersected(rect);

    painter->drawPixmap(inter.x(), inter.y(), pixmap, inter.x() - aligned.x(), inter.y() - aligned.y(), qRound(inter.width() * scale), qRound(inter.height() *scale));
}